

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff.c
# Opt level: O3

riff * riff_parse(DUMBFILE *f,int32 offset,int32 size,uint proper)

{
  riff_chunk *prVar1;
  int iVar2;
  int32 iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  riff *stream;
  riff_chunk *__ptr;
  riff *prVar7;
  ulong uVar8;
  
  if (7 < size) {
    iVar2 = dumbfile_seek(f,(long)offset,0);
    if (iVar2 != 0) {
      return (riff *)0x0;
    }
    iVar3 = dumbfile_mgetl(f);
    if (((iVar3 == 0x52494646) && (uVar4 = dumbfile_igetl(f), 3 < uVar4 && uVar4 + 8 <= (uint)size))
       && (stream = (riff *)malloc(0x10), stream != (riff *)0x0)) {
      uVar5 = dumbfile_mgetl(f);
      stream->type = uVar5;
      stream->chunk_count = 0;
      stream->chunks = (riff_chunk *)0x0;
      uVar4 = uVar4 - 4;
      if (uVar4 == 0) {
        return stream;
      }
      __ptr = (riff_chunk *)0x0;
      uVar8 = 0;
      while ((iVar2 = dumbfile_error(f), iVar2 == 0 && (7 < uVar4))) {
        uVar5 = (int)uVar8 + 1;
        __ptr = (riff_chunk *)realloc(__ptr,(ulong)uVar5 * 0x18);
        stream->chunks = __ptr;
        if (__ptr == (riff_chunk *)0x0) break;
        uVar6 = dumbfile_mgetl(f);
        __ptr[uVar8].type = uVar6;
        uVar6 = dumbfile_igetl(f);
        __ptr[uVar8].size = uVar6;
        iVar2 = dumbfile_pos(f);
        __ptr[uVar8].offset = iVar2;
        uVar4 = uVar4 - 8;
        uVar6 = __ptr[uVar8].size;
        if (uVar4 < uVar6) {
LAB_00720b19:
          if (uVar4 == 0) {
            return stream;
          }
          break;
        }
        prVar1 = __ptr + uVar8;
        if (prVar1->type == 0x52494646) {
          prVar7 = riff_parse(f,iVar2 + -8,uVar6 + 8,proper);
          prVar1->nested = prVar7;
          if (prVar7 == (riff *)0x0) goto LAB_00720b19;
          iVar2 = prVar1->offset;
          uVar6 = prVar1->size;
        }
        else {
          prVar1->nested = (riff *)0x0;
        }
        dumbfile_seek(f,(ulong)(uVar6 + iVar2),0);
        uVar4 = uVar4 - prVar1->size;
        if ((proper != 0) && ((prVar1->size & 1) != 0)) {
          dumbfile_skip(f,1);
          uVar4 = uVar4 - 1;
        }
        stream->chunk_count = uVar5;
        uVar8 = (ulong)uVar5;
        if (uVar4 == 0) {
          return stream;
        }
      }
      riff_free(stream);
    }
  }
  return (riff *)0x0;
}

Assistant:

struct riff * riff_parse( DUMBFILE * f, int32 offset, int32 size, unsigned proper )
{
	unsigned stream_size;
	struct riff * stream;


    if ( size < 8 ) return 0;

    if ( dumbfile_seek(f, offset, DFS_SEEK_SET) ) return 0;
    if ( dumbfile_mgetl(f) != DUMB_ID('R','I','F','F') ) return 0;

    stream_size = dumbfile_igetl(f);
    if ( stream_size + 8 > (unsigned)size ) return 0;
	if ( stream_size < 4 ) return 0;

    stream = (struct riff *) malloc( sizeof( struct riff ) );
	if ( ! stream ) return 0;

    stream->type = dumbfile_mgetl(f);
	stream->chunk_count = 0;
	stream->chunks = 0;

	stream_size -= 4;

    while ( stream_size && !dumbfile_error(f) )
	{
		struct riff_chunk * chunk;
		if ( stream_size < 8 ) break;
        stream->chunks = ( struct riff_chunk * ) realloc( stream->chunks, ( stream->chunk_count + 1 ) * sizeof( struct riff_chunk ) );
		if ( ! stream->chunks ) break;
		chunk = stream->chunks + stream->chunk_count;
        chunk->type = dumbfile_mgetl(f);
        chunk->size = dumbfile_igetl(f);
        chunk->offset = dumbfile_pos(f);
		stream_size -= 8;
		if ( stream_size < chunk->size ) break;
        if ( chunk->type == DUMB_ID('R','I','F','F') )
		{
            chunk->nested = riff_parse( f, chunk->offset - 8, chunk->size + 8, proper );
            if ( ! chunk->nested ) break;
		}
		else
		{
            chunk->nested = 0;
		}
        dumbfile_seek(f, chunk->offset + chunk->size, DFS_SEEK_SET);
		stream_size -= chunk->size;
		if ( proper && ( chunk->size & 1 ) )
		{
            dumbfile_skip(f, 1);
			-- stream_size;
		}
		++stream->chunk_count;
	}
	
	if ( stream_size )
	{
		riff_free( stream );
		stream = 0;
	}

	return stream;
}